

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo-vm.c
# Opt level: O0

_Bool bindMethod(ObjClass *klass,ObjString *name)

{
  _Bool _Var1;
  ObjBoundMethod *pOVar2;
  Table *in_RSI;
  ObjBoundMethod *bound;
  Value method;
  ObjClosure *in_stack_ffffffffffffffd8;
  ObjString *in_stack_ffffffffffffffe0;
  
  _Var1 = tableGet(in_RSI,in_stack_ffffffffffffffe0,(Value *)in_stack_ffffffffffffffd8);
  if (_Var1) {
    peek(0);
    pOVar2 = newBoundMethod((Value)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    pop();
    push((ulong)pOVar2 | 0xfffc000000000000);
  }
  else {
    runtimeError("Undefined property \'%s\'.",in_RSI[1].entries);
  }
  return _Var1;
}

Assistant:

static bool bindMethod(ObjClass* klass, ObjString* name) {
    Value method;
    if (!tableGet(&klass->methods, name, &method)) {
        runtimeError("Undefined property '%s'.", name->chars);
        return false;
    }

    ObjBoundMethod* bound = newBoundMethod(peek(0), AS_CLOSURE(method));
    pop();
    push(OBJ_VAL(bound));
    return true;
}